

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kazsignal.h
# Opt level: O2

int __thiscall
sig::ProtoSignal<void_()>::connect
          (ProtoSignal<void_()> *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  undefined4 in_register_00000034;
  _func_void *p_Var1;
  shared_ptr<sig::ConnectionImpl> conn_impl;
  size_t id;
  __shared_ptr<sig::ConnectionImpl,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<sig::ConnectionImpl,_(__gnu_cxx::_Lock_policy)2> local_60;
  _Any_data local_50 [2];
  __shared_ptr<sig::ConnectionImpl,_(__gnu_cxx::_Lock_policy)2> local_30;
  undefined8 local_20;
  
  p_Var1 = (_func_void *)CONCAT44(in_register_00000034,__fd);
  LOCK();
  *(long *)(p_Var1 + 8) = *(long *)(p_Var1 + 8) + 1;
  UNLOCK();
  local_20 = *(undefined8 *)(p_Var1 + 8);
  local_50[0]._0_8_ = p_Var1;
  std::make_shared<sig::ConnectionImpl,sig::ProtoSignal<void()>*,unsigned_long&>
            ((ProtoSignal<void_()> **)&local_70,(unsigned_long *)local_50[0]._M_pod_data);
  std::function<void_()>::function((function<void_()> *)local_50,(function<void_()> *)__addr);
  std::__shared_ptr<sig::ConnectionImpl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,&local_70);
  threadsafe::ring_buffer<sig::ProtoSignal<void_()>::Link>::push_back
            ((ring_buffer<sig::ProtoSignal<void_()>::Link> *)(p_Var1 + 0x10),(value_type *)local_50)
  ;
  Link::~Link((Link *)local_50);
  std::__shared_ptr<sig::ConnectionImpl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_60,&local_70);
  std::__weak_ptr<sig::ConnectionImpl,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<sig::ConnectionImpl,void>
            ((__weak_ptr<sig::ConnectionImpl,(__gnu_cxx::_Lock_policy)2> *)this,&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
  return (int)this;
}

Assistant:

Connection connect(const callback& func) {
        size_t id = increment_counter();
        auto conn_impl = std::make_shared<ConnectionImpl>(this, id);
        links_.push_back({func, conn_impl});
        return Connection(conn_impl);
    }